

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::LinearSegmentParameter::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LinearSegmentParameter *this)

{
  ostream *poVar1;
  ostream *poVar2;
  char cVar3;
  ulong uVar4;
  KString local_3a0;
  KString local_380;
  string local_360 [32];
  undefined1 local_340 [392];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_1a8,"LinearSegmentParameter:\n");
  poVar1 = std::operator<<(poVar1,"\tSegment Number:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8SegNum);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tModification:\n");
  poVar1 = std::operator<<(poVar1,"\t\tLocation:      ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_ModificationUnion).m_ui8Modifications & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\t\tOrientation:   ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_ModificationUnion).m_ui8Modifications >> 1 & 1);
  poVar2 = std::operator<<(poVar1,"\n");
  LinearObjectAppearance::GetAsString_abi_cxx11_(&local_3a0,&this->m_ObjApr);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar1 = (ostream *)(local_340 + 0x10);
  std::operator<<(poVar1,'\t');
  uVar4 = 0;
  while( true ) {
    uVar4 = uVar4 & 0xffff;
    if (local_3a0._M_string_length <= uVar4) break;
    cVar3 = local_3a0._M_dataplus._M_p[uVar4];
    if (local_3a0._M_string_length - 1 != uVar4 && cVar3 == '\n') {
      cVar3 = '\t';
      std::operator<<(poVar1,'\n');
    }
    std::operator<<(poVar1,cVar3);
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  poVar1 = std::operator<<(poVar2,local_360);
  poVar1 = std::operator<<(poVar1,"\tLocation:        ");
  WorldCoordinates::GetAsString_abi_cxx11_((KString *)local_340,&this->m_Loc);
  poVar1 = std::operator<<(poVar1,(string *)local_340);
  poVar1 = std::operator<<(poVar1,"\tOrientation:     ");
  EulerAngles::GetAsString_abi_cxx11_(&local_380,&this->m_Ori);
  poVar1 = std::operator<<(poVar1,(string *)&local_380);
  poVar1 = std::operator<<(poVar1,"\tLength:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Length);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tWidth:           ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Width);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tHeight:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Height);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tDepth:           ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Depth);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString LinearSegmentParameter::GetAsString() const
{
    KStringStream ss;

    ss << "LinearSegmentParameter:\n"
       << "\tSegment Number:  " << ( KUINT16 )m_ui8SegNum                     << "\n"
       << "\tModification:\n"
       << "\t\tLocation:      " << ( KUINT16 )m_ModificationUnion.m_ui8LocBit << "\n"
       << "\t\tOrientation:   " << ( KUINT16 )m_ModificationUnion.m_ui8OriBit << "\n"
       << IndentString( m_ObjApr.GetAsString(), 1 )
       << "\tLocation:        " << m_Loc.GetAsString()
       << "\tOrientation:     " << m_Ori.GetAsString()
       << "\tLength:          " << m_ui16Length                                 << "\n"
       << "\tWidth:           " << m_ui16Width                                  << "\n"
       << "\tHeight:          " << m_ui16Height                                 << "\n"
       << "\tDepth:           " << m_ui16Depth                                  << "\n";

    return ss.str();
}